

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefix.c
# Opt level: O0

uint16_t prefixes_set_unused_mask(_PrefixState *ps)

{
  uint uVar1;
  uint16_t unusedPrefixesMask;
  _iflags unusedPrefixesDiff;
  _PrefixState *ps_local;
  
  uVar1 = ps->decodedPrefixes ^ ps->usedPrefixes;
  unusedPrefixesMask = ps->unusedPrefixesMask;
  if (uVar1 != 0) {
    if ((uVar1 & 0x2000000) != 0) {
      unusedPrefixesMask = unusedPrefixesMask | ps->pfxIndexer[0];
    }
    if ((uVar1 & 0x1f80) != 0) {
      unusedPrefixesMask = unusedPrefixesMask | ps->pfxIndexer[2];
    }
    if ((uVar1 & 0x70) != 0) {
      unusedPrefixesMask = unusedPrefixesMask | ps->pfxIndexer[1];
    }
    if ((uVar1 & 0x2000) != 0) {
      unusedPrefixesMask = unusedPrefixesMask | ps->pfxIndexer[3];
    }
    if ((uVar1 & 0x4000) != 0) {
      unusedPrefixesMask = unusedPrefixesMask | ps->pfxIndexer[4];
    }
  }
  return unusedPrefixesMask;
}

Assistant:

uint16_t prefixes_set_unused_mask(_PrefixState* ps)
{
	/*
	 * The decodedPrefixes represents the prefixes that were *read* from the binary stream for the instruction.
	 * The usedPrefixes represents the prefixes that were actually used by the instruction in the *decode* phase.
	 * Xoring between the two will result in a 'diff' which returns the prefixes that were read
	 * from the stream *and* that were never used in the actual decoding.
	 *
	 * Only one prefix per type can be set in decodedPrefixes from the stream.
	 * Therefore it's enough to check each type once and set the flag accordingly.
	 * That's why we had to book-keep each prefix type and its position.
	 * So now we know which bits we need to set exactly in the mask.
	 */
	_iflags unusedPrefixesDiff = ps->decodedPrefixes ^ ps->usedPrefixes;
	uint16_t unusedPrefixesMask = ps->unusedPrefixesMask;

	/* Examine unused prefixes by type: */
	/*
	 * About REX: it might be set in the diff although it was never in the stream itself.
	 * This is because the vrex is shared between VEX and REX and some places flag it as REX usage, while
	 * we were really decoding an AVX instruction.
	 * It's not a big problem, because the prefixes_ignore func will ignore it anyway,
	 * since it wasn't seen earlier. But it's important to know this.
	 */
	if (unusedPrefixesDiff) {
		if (unusedPrefixesDiff & INST_PRE_REX) unusedPrefixesMask |= ps->pfxIndexer[PFXIDX_REX];
		if (unusedPrefixesDiff & INST_PRE_SEGOVRD_MASK) unusedPrefixesMask |= ps->pfxIndexer[PFXIDX_SEG];
		if (unusedPrefixesDiff & INST_PRE_LOKREP_MASK) unusedPrefixesMask |= ps->pfxIndexer[PFXIDX_LOREP];
		if (unusedPrefixesDiff & INST_PRE_OP_SIZE) unusedPrefixesMask |= ps->pfxIndexer[PFXIDX_OP_SIZE];
		if (unusedPrefixesDiff & INST_PRE_ADDR_SIZE) unusedPrefixesMask |= ps->pfxIndexer[PFXIDX_ADRS];
		/* If a VEX instruction was found, its prefix is considered as used, therefore no point for checking for it. */
	}

	return unusedPrefixesMask;
}